

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::surroundingNodes(BoxList *this)

{
  bool bVar1;
  BoxList *in_RDI;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  int i;
  reference in_stack_ffffffffffffff78;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_68 [3];
  int local_4c;
  reference local_48;
  int local_3c;
  IndexType *local_38;
  int local_2c;
  IndexType *local_28;
  int local_1c;
  undefined4 local_18;
  int local_14;
  IntVect *local_10;
  IndexType *local_8;
  
  local_68[0]._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_ffffffffffffff78);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_RDI,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff78 =
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*(local_68);
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      local_38 = &in_stack_ffffffffffffff78->btype;
      local_3c = local_4c;
      local_2c = local_4c;
      local_1c = local_4c;
      if ((local_38->itype & 1 << ((byte)local_4c & 0x1f)) == 0) {
        local_10 = &in_stack_ffffffffffffff78->bigend;
        local_14 = local_4c;
        local_18 = 1;
        local_10->vect[local_4c] = local_10->vect[local_4c] + 1;
      }
      local_28 = local_38;
    }
    local_8 = &in_stack_ffffffffffffff78->btype;
    local_8->itype = 7;
    local_48 = in_stack_ffffffffffffff78;
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_68);
  }
  return in_RDI;
}

Assistant:

BoxList&
BoxList::surroundingNodes () noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.surroundingNodes();
    }
    return *this;
}